

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAdES.cpp
# Opt level: O1

bool __thiscall DisplayText::Decode(DisplayText *this,uchar *pIn,size_t cbIn,size_t *cbUsed)

{
  byte bVar1;
  bool bVar2;
  DisplayTextType DVar3;
  
  if (cbIn < 2) {
    return false;
  }
  bVar1 = *pIn;
  if (bVar1 < 0x1a) {
    if (bVar1 == 5) {
      DVar3 = NotSet;
    }
    else {
      if (bVar1 != 0xc) {
        return false;
      }
      DVar3 = UTF8;
    }
  }
  else if (bVar1 == 0x1a) {
    DVar3 = Visible;
  }
  else {
    if (bVar1 != 0x1e) {
      return false;
    }
    DVar3 = BMP;
  }
  this->type = DVar3;
  bVar2 = AnyType::Decode(&this->value,pIn,cbIn,cbUsed);
  return bVar2;
}

Assistant:

bool DisplayText::Decode(const unsigned char * pIn, size_t cbIn, size_t & cbUsed)
{
    if (cbIn < 2)
        return false;

    switch (static_cast<DerType>(pIn[0]))
    {
    case DerType::VisibleString:
        type = DisplayTextType::Visible;
        break;
    case DerType::UTF8String:
        type = DisplayTextType::UTF8;
        break;
    case DerType::BMPString:
        type = DisplayTextType::BMP;
        break;
    case DerType::Null:
        type = DisplayTextType::NotSet;
        break;
    default:
        return false;
    }

    return value.Decode(pIn, cbIn, cbUsed);
}